

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::getOutFlowFaces
          (NavierStokesBase *this,
          Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *outFaces)

{
  Orientation *pOVar1;
  Long LVar2;
  size_type in_RDI;
  int len_1;
  int len;
  int idir;
  undefined4 in_stack_ffffffffffffffb8;
  Orientation in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  Orientation in_stack_ffffffffffffffc4;
  int local_34;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  std::vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::resize
            ((vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    iVar3 = local_34;
    if (phys_bc.bc[local_34] == 2) {
      amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::size
                ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)0x51d9ed);
      std::vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::resize
                ((vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
                 CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_RDI);
      amrex::Orientation::Orientation((Orientation *)&stack0xffffffffffffffc4,local_34,low);
      pOVar1 = amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::operator[]
                         ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4.val,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc.val,in_stack_ffffffffffffffb8));
      pOVar1->val = in_stack_ffffffffffffffc4.val;
    }
    if (phys_bc.bc[local_34 + 3] == 2) {
      LVar2 = amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::size
                        ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)0x51da5d
                        );
      in_stack_ffffffffffffffc0 = (undefined4)LVar2;
      std::vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::resize
                ((vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
                 CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_RDI);
      amrex::Orientation::Orientation((Orientation *)&stack0xffffffffffffffbc,local_34,high);
      pOVar1 = amrex::Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_>::operator[]
                         ((Vector<amrex::Orientation,_std::allocator<amrex::Orientation>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4.val,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc.val,in_stack_ffffffffffffffb8));
      pOVar1->val = in_stack_ffffffffffffffbc.val;
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::getOutFlowFaces (Vector<Orientation>& outFaces)
{
    outFaces.resize(0);
    for (int idir = 0; idir < AMREX_SPACEDIM; idir++)
    {
        if (phys_bc.lo(idir) == Outflow)
        {
            const int len = outFaces.size();
            outFaces.resize(len+1);
            outFaces[len] = Orientation(idir,Orientation::low);
        }

        if (phys_bc.hi(idir) == Outflow)
        {
            const int len = outFaces.size();
            outFaces.resize(len+1);
            outFaces[len] = Orientation(idir,Orientation::high);
        }
    }
}